

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O0

void xLearn::RMSDMetric::rmsd_accum_thread
               (vector<float,_std::allocator<float>_> *Y,vector<float,_std::allocator<float>_> *pred
               ,real_t *error,size_t start_idx,size_t end_idx)

{
  float fVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  ostream *poVar4;
  const_reference pvVar5;
  ulong in_RCX;
  uint *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  ulong in_R8;
  real_t tmp;
  size_t i;
  string *function;
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  LogSeverity in_stack_ffffffffffffff74;
  string local_88 [55];
  undefined1 local_51 [37];
  Logger local_2c;
  ulong local_28;
  ulong local_20;
  uint *local_18;
  vector<float,_std::allocator<float>_> *local_10;
  vector<float,_std::allocator<float>_> *local_8;
  
  local_28 = in_R8;
  if (in_R8 < in_RCX) {
    local_20 = in_RCX;
    Logger::Logger(&local_2c,ERR);
    function = (string *)local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_51 + 1),
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h"
               ,(allocator *)function);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"rmsd_accum_thread",(allocator *)&stack0xffffffffffffff77)
    ;
    poVar3 = Logger::Start(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,
                           in_stack_ffffffffffffff64,function);
    poVar3 = std::operator<<(poVar3,"CHECK_GE failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x30a);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"end_idx");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"start_idx");
    poVar3 = std::operator<<(poVar3," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar3,local_20);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
    std::__cxx11::string::~string((string *)(local_51 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_51);
    Logger::~Logger((Logger *)poVar3);
    abort();
  }
  *in_RDX = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (; in_RCX < local_28; in_RCX = in_RCX + 1) {
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](local_8,in_RCX);
    fVar1 = *pvVar5;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](local_10,in_RCX);
    auVar2 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 - *pvVar5)),ZEXT416((uint)(fVar1 - *pvVar5)),
                             ZEXT416(*local_18));
    *local_18 = auVar2._0_4_;
  }
  return;
}

Assistant:

static void rmsd_accum_thread(const std::vector<real_t>* Y,
                                const std::vector<real_t>* pred,
                                real_t* error,
                                size_t start_idx,
                                size_t end_idx) {
    CHECK_GE(end_idx, start_idx);
    *error = 0;
    for (size_t i = start_idx; i < end_idx; ++i) {
      real_t tmp = (*Y)[i] - (*pred)[i];
      (*error) += tmp * tmp;
    }
  }